

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_htmlReadMemory(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *val;
  char *val_00;
  char *val_01;
  htmlDocPtr val_02;
  int local_54;
  int n_options;
  int options;
  int n_encoding;
  char *encoding;
  int n_url;
  char *url;
  int local_28;
  int n_size;
  int size;
  int n_buffer;
  char *buffer;
  htmlDocPtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (n_size = 0; n_size < 4; n_size = n_size + 1) {
    for (url._4_4_ = 0; (int)url._4_4_ < 4; url._4_4_ = url._4_4_ + 1) {
      for (encoding._4_4_ = 0; (int)encoding._4_4_ < 4; encoding._4_4_ = encoding._4_4_ + 1) {
        for (n_options = 0; n_options < 4; n_options = n_options + 1) {
          for (local_54 = 0; local_54 < 4; local_54 = local_54 + 1) {
            iVar1 = xmlMemBlocks();
            val = gen_const_char_ptr(n_size,0);
            local_28 = gen_int(url._4_4_,1);
            val_00 = gen_const_char_ptr(encoding._4_4_,2);
            val_01 = gen_const_char_ptr(n_options,3);
            iVar2 = gen_int(local_54,4);
            if (val != (char *)0x0) {
              iVar3 = xmlStrlen(val);
              if (iVar3 < local_28) {
                local_28 = 0;
              }
            }
            val_02 = (htmlDocPtr)htmlReadMemory(val,local_28,val_00,val_01,iVar2);
            desret_htmlDocPtr(val_02);
            call_tests = call_tests + 1;
            des_const_char_ptr(n_size,val,0);
            des_int(url._4_4_,local_28,1);
            des_const_char_ptr(encoding._4_4_,val_00,2);
            des_const_char_ptr(n_options,val_01,3);
            des_int(local_54,iVar2,4);
            xmlResetLastError();
            iVar2 = xmlMemBlocks();
            if (iVar1 != iVar2) {
              iVar2 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlReadMemory",(ulong)(uint)(iVar2 - iVar1));
              ret_val._4_4_ = ret_val._4_4_ + 1;
              printf(" %d",(ulong)(uint)n_size);
              printf(" %d",(ulong)url._4_4_);
              printf(" %d",(ulong)encoding._4_4_);
              printf(" %d",(ulong)(uint)n_options);
              printf(" %d");
              printf("\n");
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_htmlReadMemory(void) {
    int test_ret = 0;

#if defined(LIBXML_HTML_ENABLED)
    int mem_base;
    htmlDocPtr ret_val;
    const char * buffer; /* a pointer to a char array */
    int n_buffer;
    int size; /* the size of the array */
    int n_size;
    const char * url; /* only used for error reporting (optional) */
    int n_url;
    const char * encoding; /* the document encoding, or NULL */
    int n_encoding;
    int options; /* a combination of htmlParserOption(s) */
    int n_options;

    for (n_buffer = 0;n_buffer < gen_nb_const_char_ptr;n_buffer++) {
    for (n_size = 0;n_size < gen_nb_int;n_size++) {
    for (n_url = 0;n_url < gen_nb_const_char_ptr;n_url++) {
    for (n_encoding = 0;n_encoding < gen_nb_const_char_ptr;n_encoding++) {
    for (n_options = 0;n_options < gen_nb_int;n_options++) {
        mem_base = xmlMemBlocks();
        buffer = gen_const_char_ptr(n_buffer, 0);
        size = gen_int(n_size, 1);
        url = gen_const_char_ptr(n_url, 2);
        encoding = gen_const_char_ptr(n_encoding, 3);
        options = gen_int(n_options, 4);
        if ((buffer != NULL) &&
            (size > xmlStrlen(BAD_CAST buffer)))
            size = 0;

        ret_val = htmlReadMemory(buffer, size, url, encoding, options);
        desret_htmlDocPtr(ret_val);
        call_tests++;
        des_const_char_ptr(n_buffer, buffer, 0);
        des_int(n_size, size, 1);
        des_const_char_ptr(n_url, url, 2);
        des_const_char_ptr(n_encoding, encoding, 3);
        des_int(n_options, options, 4);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in htmlReadMemory",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_buffer);
            printf(" %d", n_size);
            printf(" %d", n_url);
            printf(" %d", n_encoding);
            printf(" %d", n_options);
            printf("\n");
        }
    }
    }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}